

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCheck.c
# Opt level: O2

int Aig_ManCheck(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pGhost;
  ulong uVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  int iVar6;
  char *__format;
  
  iVar6 = 0;
  do {
    if (p->vCis->nSize <= iVar6) {
      iVar6 = 0;
      goto LAB_00518d21;
    }
    pGhost = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar6);
  } while ((pGhost->pFanin0 < (Aig_Obj_t *)0x2) &&
          (iVar6 = iVar6 + 1, pGhost->pFanin1 < (Aig_Obj_t *)0x2));
  __format = "Aig_ManCheck: The PI node \"%p\" has fanins.\n";
  goto LAB_00518d11;
LAB_00518d4c:
  iVar1 = p->vObjs->nSize;
  if (iVar1 <= iVar6) {
    if (iVar1 - p->nDeleted !=
        p->nObjs[6] + p->nObjs[5] + p->nObjs[3] + p->nObjs[4] + p->nObjs[2] + 1) {
      puts("Aig_ManCheck: The number of created nodes is wrong.");
      printf("C1 = %d. Pi = %d. Po = %d. Buf = %d. And = %d. Xor = %d. Total = %d.\n",1);
      uVar2 = p->vObjs->nSize;
      printf("Created = %d. Deleted = %d. Existing = %d.\n",(ulong)uVar2,(ulong)(uint)p->nDeleted,
             (ulong)(uVar2 - p->nDeleted));
      return 0;
    }
    iVar6 = Aig_TableCountEntries(p);
    if (iVar6 == p->nObjs[6] + p->nObjs[5]) {
      return 1;
    }
    puts("Aig_ManCheck: The number of nodes in the structural hashing table is wrong.");
    uVar2 = Aig_TableCountEntries(p);
    printf("Entries = %d. And = %d. Xor = %d. Total = %d.\n",(ulong)uVar2,(ulong)(uint)p->nObjs[5],
           (ulong)(uint)p->nObjs[6],(ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
    return 0;
  }
  pGhost = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar6);
  if ((pGhost != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pGhost->field_0x18 & 7) - 7)) {
    uVar3 = (ulong)pGhost->pFanin0 & 0xfffffffffffffffe;
    if ((uVar3 == 0) || (uVar5 = (ulong)pGhost->pFanin1 & 0xfffffffffffffffe, uVar5 == 0)) {
      __format = "Aig_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n";
      goto LAB_00518d11;
    }
    if (*(int *)(uVar5 + 0x24) <= *(int *)(uVar3 + 0x24)) {
      __format = "Aig_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n";
      goto LAB_00518d11;
    }
    pAVar4 = Aig_TableLookup(p,pGhost);
    if (pAVar4 != pGhost) {
      __format = "Aig_ManCheck: Node \"%p\" is not in the structural hashing table.\n";
      goto LAB_00518d11;
    }
  }
  iVar6 = iVar6 + 1;
  goto LAB_00518d4c;
  while (iVar6 = iVar6 + 1, pGhost->pFanin1 < (Aig_Obj_t *)0x2) {
LAB_00518d21:
    if (p->vCos->nSize <= iVar6) {
      iVar6 = 0;
      goto LAB_00518d4c;
    }
    pGhost = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar6);
    if (pGhost->pFanin0 < (Aig_Obj_t *)0x2) {
      __format = "Aig_ManCheck: The PO node \"%p\" has NULL fanin.\n";
      goto LAB_00518d11;
    }
  }
  __format = "Aig_ManCheck: The PO node \"%p\" has second fanin.\n";
LAB_00518d11:
  printf(__format,pGhost);
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the consistency of the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManCheck( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pObj2;
    int i;
    // check primary inputs
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( Aig_ObjFanin0(pObj) || Aig_ObjFanin1(pObj) )
        {
            printf( "Aig_ManCheck: The PI node \"%p\" has fanins.\n", pObj );
            return 0;
        }
    }
    // check primary outputs
    Aig_ManForEachCo( p, pObj, i )
    {
        if ( !Aig_ObjFanin0(pObj) )
        {
            printf( "Aig_ManCheck: The PO node \"%p\" has NULL fanin.\n", pObj );
            return 0;
        }
        if ( Aig_ObjFanin1(pObj) )
        {
            printf( "Aig_ManCheck: The PO node \"%p\" has second fanin.\n", pObj );
            return 0;
        }
    }
    // check internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( !Aig_ObjFanin0(pObj) || !Aig_ObjFanin1(pObj) )
        {
            printf( "Aig_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n", pObj );
            return 0;
        }
        if ( Aig_ObjFanin0(pObj)->Id >= Aig_ObjFanin1(pObj)->Id )
        {
            printf( "Aig_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n", pObj );
            return 0;
        }
        pObj2 = Aig_TableLookup( p, pObj );
        if ( pObj2 != pObj )
        {
            printf( "Aig_ManCheck: Node \"%p\" is not in the structural hashing table.\n", pObj );
            return 0;
        }
    }
    // count the total number of nodes
    if ( Aig_ManObjNum(p) != 1 + Aig_ManCiNum(p) + Aig_ManCoNum(p) + 
        Aig_ManBufNum(p) + Aig_ManAndNum(p) + Aig_ManExorNum(p) )
    {
        printf( "Aig_ManCheck: The number of created nodes is wrong.\n" );
        printf( "C1 = %d. Pi = %d. Po = %d. Buf = %d. And = %d. Xor = %d. Total = %d.\n",
            1, Aig_ManCiNum(p), Aig_ManCoNum(p), Aig_ManBufNum(p), Aig_ManAndNum(p), Aig_ManExorNum(p), 
            1 + Aig_ManCiNum(p) + Aig_ManCoNum(p) + Aig_ManBufNum(p) + Aig_ManAndNum(p) + Aig_ManExorNum(p) );
        printf( "Created = %d. Deleted = %d. Existing = %d.\n",
            Aig_ManObjNumMax(p), p->nDeleted, Aig_ManObjNum(p) );
        return 0;
    }
    // count the number of nodes in the table
    if ( Aig_TableCountEntries(p) != Aig_ManAndNum(p) + Aig_ManExorNum(p) )
    {
        printf( "Aig_ManCheck: The number of nodes in the structural hashing table is wrong.\n" );
        printf( "Entries = %d. And = %d. Xor = %d. Total = %d.\n", 
            Aig_TableCountEntries(p), Aig_ManAndNum(p), Aig_ManExorNum(p), 
            Aig_ManAndNum(p) + Aig_ManExorNum(p) );

        return 0;
    }
//    if ( !Aig_ManIsAcyclic(p) )
//        return 0;
    return 1; 
}